

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

void __thiscall
LNodeF0Stmt::LNodeF0Stmt
          (LNodeF0Stmt *this,shared_ptr<LNode> *var,shared_ptr<LNode> *from_expr,
          shared_ptr<LNode> *to_expr,shared_ptr<LNode> *stmts)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (from_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (from_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (from_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (from_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (to_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (to_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (to_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (to_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeF0Stmt(std::shared_ptr<LNode> var, std::shared_ptr<LNode> from_expr,
                std::shared_ptr<LNode> to_expr, std::shared_ptr<LNode> stmts) {
        this->var = std::move(var);
        this->from_expr = std::move(from_expr);
        this->to_expr = std::move(to_expr);
        this->stmts = std::move(stmts);
    }